

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void multi_thread_test(size_t ndocs,size_t wal_threshold,size_t time_sec,size_t nbatch,
                      size_t compact_term,size_t nwriters,size_t nreaders)

{
  fdb_doc *pfVar1;
  pthread_t __th;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  timeval b;
  int iVar5;
  fdb_status fVar6;
  ulong uVar7;
  size_t keylen;
  size_t metalen;
  size_t sVar8;
  pthread_t *ppVar9;
  undefined4 *puVar10;
  long lVar11;
  long lVar12;
  uint32_t __pshared;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  undefined4 *__arg;
  pthread_t *__newthread;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  size_t asStack_1250 [2];
  ulong uStack_1240;
  fdb_doc *local_1238;
  char keybuf [1024];
  char metabuf [1024];
  char bodybuf [1024];
  char temp [1024];
  undefined1 local_230 [8];
  fdb_config fconfig;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  timeval ts_cur;
  fdb_kvs_config kvs_config;
  timeval ts_begin;
  undefined4 local_60;
  pthread_spinlock_t local_5c;
  int n_opened;
  pthread_spinlock_t filename_count_lock;
  size_t local_50;
  fdb_file_handle *local_48;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  int filename_count;
  
  uStack_1240 = 0x10b10e;
  local_50 = time_sec;
  gettimeofday((timeval *)&kvs_info.file,(__timezone_ptr_t)0x0);
  iVar5 = (int)(nreaders + nwriters);
  lVar12 = (long)iVar5;
  uVar7 = lVar12 * 8 + 0xfU & 0xfffffffffffffff0;
  ppVar9 = (pthread_t *)((long)&local_1238 - uVar7);
  puVar10 = (undefined4 *)((long)ppVar9 + (lVar12 * -0x70 - uVar7));
  lVar11 = (long)puVar10 - (ndocs * 8 + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)(lVar11 + -8) = 1;
  uVar13 = *(ulong *)(lVar11 + -8);
  __pshared = (uint32_t)uVar13;
  local_60 = 0;
  *(undefined8 *)(lVar11 + -8) = 0x10b195;
  db._4_4_ = __pshared;
  pthread_spin_init(&local_5c,__pshared);
  *(undefined8 *)(lVar11 + -8) = 0x10b1a1;
  system("rm -rf  dummy* > errorlog.txt");
  *(undefined8 *)(lVar11 + -8) = 0x10b1b0;
  fdb_get_default_config();
  *(undefined8 *)(lVar11 + -8) = 0x10b1bf;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x100;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.flags._3_1_ = 0;
  *(undefined8 *)(lVar11 + -8) = 0x10b1e1;
  fconfig.purging_interval = __pshared;
  memleak_start();
  *(undefined8 *)(lVar11 + -8) = 0x10b1ed;
  puts("Initialize..");
  *(undefined8 *)(lVar11 + -8) = 0x10b207;
  sprintf(bodybuf + 0x3f8,"dummy%d",uVar13 & 0xffffffff);
  *(undefined8 *)(lVar11 + -8) = 0x10b219;
  fdb_open(&local_48,bodybuf + 0x3f8,(fdb_config *)local_230);
  *(undefined8 *)(lVar11 + -8) = 0x10b22b;
  fdb_kvs_open_default(local_48,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&ts_cur.tv_usec);
  *(undefined8 *)(lVar11 + -8) = 0x10b241;
  fVar6 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"multi_thread_test");
  if (fVar6 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)(lVar11 + -8) = 0x10b6a8;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x756);
    multi_thread_test(unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long)
    ::__test_pass = 1;
    *(undefined8 *)(lVar11 + -8) = 0x10b6ca;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x756,
                  "void multi_thread_test(size_t, size_t, size_t, size_t, size_t, size_t, size_t)");
  }
  *(undefined8 *)(lVar11 + -8) = 0x10b257;
  gettimeofday((timeval *)&kvs_config.custom_cmp_param,(__timezone_ptr_t)0x0);
  lVar15 = 0;
  _n_opened = ndocs;
  for (uVar13 = 0; _n_opened != uVar13; uVar13 = uVar13 + 1) {
    pcVar17 = bodybuf + 0x3f8;
    *(undefined8 *)(lVar11 + -8) = 0x5c;
    uVar3 = *(undefined8 *)(lVar11 + -8);
    *(undefined8 *)(lVar11 + -8) = 0x10b27b;
    _set_random_string_smallabt(pcVar17,(int)uVar3);
    *(undefined8 *)(lVar11 + -8) = 0x10b298;
    sprintf((char *)&local_1238,"k%07d%s",uVar13 & 0xffffffff,pcVar17);
    *(undefined8 *)(lVar11 + -8) = 0x10b2b2;
    sprintf(keybuf + 0x3f8,"m%07d",uVar13 & 0xffffffff);
    *(undefined8 *)(lVar11 + -8) = 0x55;
    uVar3 = *(undefined8 *)(lVar11 + -8);
    *(undefined8 *)(lVar11 + -8) = 0x10b2bd;
    _set_random_string_smallabt(pcVar17,(int)uVar3);
    *(undefined8 *)(lVar11 + -8) = 0x10b2d9;
    sprintf(metabuf + 0x3f8,"b%07d%07d%s",uVar13 & 0xffffffff,0,pcVar17);
    *(undefined8 *)(lVar11 + -8) = 0x10b2f0;
    keylen = strlen((char *)&local_1238);
    *(undefined8 *)(lVar11 + -8) = 0x10b2fe;
    metalen = strlen(keybuf + 0x3f8);
    *(undefined8 *)(lVar11 + -8) = 0x10b30d;
    sVar8 = strlen(metabuf + 0x3f8);
    *(size_t *)(lVar11 + -0x10) = sVar8;
    *(undefined8 *)(lVar11 + -0x18) = 0x10b33c;
    fdb_doc_create((fdb_doc **)(lVar11 + lVar15),&local_1238,keylen,keybuf + 0x3f8,metalen,
                   metabuf + 0x3f8,*(size_t *)(lVar11 + -0x10));
    pfVar1 = *(fdb_doc **)(lVar11 + uVar13 * 8);
    *(undefined8 *)(lVar11 + -8) = 0x10b34b;
    fdb_set((fdb_kvs_handle *)dbfile,pfVar1);
    lVar15 = lVar15 + 8;
  }
  *(undefined8 *)(lVar11 + -8) = 1;
  uVar3 = *(undefined8 *)(lVar11 + -8);
  *(undefined8 *)(lVar11 + -8) = 0x10b367;
  fdb_commit(local_48,(fdb_commit_opt_t)uVar3);
  uVar16 = 0;
  *(undefined8 *)(lVar11 + -8) = 0x10b37b;
  gettimeofday((timeval *)&__test_begin.tv_usec,(__timezone_ptr_t)0x0);
  b.tv_usec = ts_cur.tv_sec;
  b.tv_sec = __test_begin.tv_usec;
  *(undefined8 *)(lVar11 + -8) = 0x10b395;
  _utime_gap(stack0xffffffffffffff30,b);
  *(undefined8 *)(lVar11 + -8) = 0x10b39e;
  fdb_kvs_close((fdb_kvs_handle *)dbfile);
  *(undefined8 *)(lVar11 + -8) = 0x10b3a7;
  fdb_close(local_48);
  __arg = puVar10;
  __newthread = ppVar9;
  uVar13 = nreaders + nwriters & 0xffffffff;
  if (iVar5 < 1) {
    uVar13 = uVar16;
  }
  for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
    *__arg = (int)uVar16;
    *(long *)(__arg + 2) = lVar12;
    *(ulong *)(__arg + 6) = (ulong)(uVar16 < nwriters);
    *(size_t *)(__arg + 4) = _n_opened;
    *(long *)(__arg + 8) = lVar11;
    *(size_t *)(__arg + 10) = local_50;
    *(size_t *)(__arg + 0xc) = nbatch;
    *(size_t *)(__arg + 0xe) = compact_term;
    *(undefined4 **)(__arg + 0x10) = &local_60;
    *(long *)(__arg + 0x12) = (long)&db + 4;
    *(pthread_spinlock_t **)(__arg + 0x14) = &local_5c;
    *(undefined1 **)(__arg + 0x18) = local_230;
    *(__suseconds_t **)(__arg + 0x1a) = &ts_cur.tv_usec;
    *(undefined8 *)(lVar11 + -8) = 0x10b457;
    pthread_create(__newthread,(pthread_attr_t *)0x0,_worker_thread,__arg);
    __arg = __arg + 0x1c;
    __newthread = __newthread + 1;
  }
  *(undefined8 *)(lVar11 + -8) = 0x10b47b;
  printf("wait for %d seconds..\n",local_50);
  uVar16 = _n_opened;
  for (lVar12 = 0; uVar13 * 8 - lVar12 != 0; lVar12 = lVar12 + 8) {
    __th = *(pthread_t *)((long)ppVar9 + lVar12);
    *(undefined8 *)(lVar11 + -8) = 0x10b4a4;
    pthread_join(__th,(void **)((long)ppVar9 + (lVar12 - uVar7)));
  }
  for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
    pfVar1 = *(fdb_doc **)(lVar11 + uVar7 * 8);
    *(undefined8 *)(lVar11 + -8) = 0x10b4c2;
    fdb_doc_free(pfVar1);
  }
  lVar15 = 0;
  lVar18 = 0;
  for (lVar12 = 0; uVar13 * 0x70 - lVar12 != 0; lVar12 = lVar12 + 0x70) {
    lVar2 = *(long *)((long)puVar10 + lVar12 + 0x58);
    lVar14 = lVar2;
    lVar4 = 0;
    if (*(long *)((long)puVar10 + lVar12 + 0x18) == 0) {
      lVar14 = 0;
      lVar4 = lVar2;
    }
    lVar15 = lVar15 + lVar4;
    lVar18 = lVar18 + lVar14;
  }
  auVar19._8_4_ = (int)((ulong)lVar15 >> 0x20);
  auVar19._0_8_ = lVar15;
  auVar19._12_4_ = 0x45300000;
  auVar20._8_4_ = (int)(local_50 >> 0x20);
  auVar20._0_8_ = local_50;
  auVar20._12_4_ = 0x45300000;
  dVar22 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0);
  *(undefined8 *)(lVar11 + -8) = 0x10b557;
  printf("read: %.1f ops/sec\n",
         ((auVar19._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) / dVar22);
  auVar21._8_4_ = (int)((ulong)lVar18 >> 0x20);
  auVar21._0_8_ = lVar18;
  auVar21._12_4_ = 0x45300000;
  *(undefined8 *)(lVar11 + -8) = 0x10b58b;
  printf("write: %.1f ops/sec\n",
         ((auVar21._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) / dVar22);
  *(undefined8 *)(lVar11 + -8) = 0x10b5a6;
  sprintf(bodybuf + 0x3f8,"dummy%d",(ulong)db._4_4_);
  *(undefined8 *)(lVar11 + -8) = 0x10b5bc;
  fdb_open(&local_48,bodybuf + 0x3f8,(fdb_config *)local_230);
  *(undefined8 *)(lVar11 + -8) = 0x10b5d2;
  fdb_kvs_open_default(local_48,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&ts_cur.tv_usec);
  *(undefined8 *)(lVar11 + -8) = 0x10b5e4;
  fdb_get_kvs_info((fdb_kvs_handle *)dbfile,(fdb_kvs_info *)&fconfig.num_blocks_readahead);
  pcVar17 = (char *)(uVar16 + lVar18);
  if (kvs_info.name != pcVar17) {
    *(undefined8 *)(lVar11 + -8) = 0x10b611;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7a4);
    multi_thread_test(unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long)
    ::__test_pass = '\x01';
    if (kvs_info.name != pcVar17) {
      *(code **)(lVar11 + -8) = multi_thread_client_shutdown;
      __assert_fail("kvs_info.last_seqnum == ndocs+nwrites",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x7a4,
                    "void multi_thread_test(size_t, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
  }
  *(undefined8 *)(lVar11 + -8) = 0x10b62e;
  fdb_kvs_close((fdb_kvs_handle *)dbfile);
  *(undefined8 *)(lVar11 + -8) = 0x10b637;
  fdb_close(local_48);
  *(undefined8 *)(lVar11 + -8) = 0x10b63c;
  fdb_shutdown();
  *(undefined8 *)(lVar11 + -8) = 0x10b641;
  memleak_end();
  pcVar17 = "%s PASSED\n";
  if (multi_thread_test(unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long)
      ::__test_pass != '\0') {
    pcVar17 = "%s FAILED\n";
  }
  *(undefined8 *)(lVar11 + -8) = 0x10b672;
  fprintf(_stderr,pcVar17,"multi thread test");
  return;
}

Assistant:

void multi_thread_test(
    size_t ndocs, size_t wal_threshold, size_t time_sec,
    size_t nbatch, size_t compact_term, size_t nwriters, size_t nreaders)
{
    TEST_INIT();

    size_t nwrites, nreads;
    int i, r;
    int n = nwriters + nreaders;;
    thread_t *tid = alca(thread_t, n);
    void **thread_ret = alca(void *, n);
    struct work_thread_args *args = alca(struct work_thread_args, n);
    struct timeval ts_begin, ts_cur, ts_gap;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, ndocs);
    fdb_status status;
    fdb_kvs_info kvs_info;

    int filename_count = 1;
    int n_opened = 0;
    spin_t filename_count_lock;
    spin_init(&filename_count_lock);

    char keybuf[1024], metabuf[1024], bodybuf[1024], temp[1024];

    // remove previous dummy files
    r = system(SHELL_DEL" " FILENAME "* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    memleak_start();

    // initial population ===
    DBG("Initialize..\n");

    // open db
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_thread_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_begin, NULL);

    // insert documents
    for (i = 0; (size_t)i < ndocs; ++i){
        _set_random_string_smallabt(temp, KSIZE - (IDX_DIGIT+1));
        sprintf(keybuf, "k%0" IDX_DIGIT_STR "d%s", i, temp);

        sprintf(metabuf, "m%0" IDX_DIGIT_STR "d", i);

        _set_random_string_smallabt(temp, VSIZE-(IDX_DIGIT*2+1));
        sprintf(bodybuf, "b%0" IDX_DIGIT_STR "d%0" IDX_DIGIT_STR "d%s", i, 0, temp);

        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);
    //DBG("%d.%09d seconds elapsed\n", (int)ts_gap.tv_sec, (int)ts_gap.tv_nsec);

    fdb_kvs_close(db);
    fdb_close(dbfile);
    // end of population ===

    // drop OS's page cache
    //r = system("free && sync && echo 3 > /proc/sys/vm/drop_caches && free");

    // create workers
    for (i=0;i<n;++i){
        args[i].tid = i;
        args[i].nthreads = n;
        args[i].writer = (((size_t)i<nwriters)?(1):(0));
        args[i].ndocs = ndocs;
        args[i].doc = doc;
        args[i].time_sec = time_sec;
        args[i].nbatch = nbatch;
        args[i].compact_term = compact_term;
        args[i].n_opened = &n_opened;
        args[i].filename_count = &filename_count;
        args[i].filename_count_lock = &filename_count_lock;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        thread_create(&tid[i], _worker_thread, &args[i]);
    }

    printf("wait for %d seconds..\n", (int)time_sec);

    // wait for thread termination
    for (i=0;i<n;++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (i=0;(size_t)i<ndocs;++i){
        fdb_doc_free(doc[i]);
    }

    nwrites = nreads = 0;
    for (i=0;i<n;++i){
        if (args[i].writer) {
            nwrites += args[i].nops;
        } else {
            nreads += args[i].nops;
        }
    }
    printf("read: %.1f ops/sec\n", (double)nreads/time_sec);
    printf("write: %.1f ops/sec\n", (double)nwrites/time_sec);

    // check sequence number
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == ndocs+nwrites);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // shutdown
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("multi thread test");
}